

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::set_current_block
          (AnalyzeVariableScopeAccessHandler *this,SPIRBlock *block)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *this_00;
  Case *pCVar4;
  Case *target;
  Case *__end2;
  Case *__begin2;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *__range2;
  anon_class_16_2_f791057a test_phi;
  SPIRBlock *block_local;
  AnalyzeVariableScopeAccessHandler *this_local;
  
  this->current_block = block;
  iVar1 = *(int *)&(block->super_IVariant).field_0xc;
  __range2 = (SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *)this;
  test_phi.this = (AnalyzeVariableScopeAccessHandler *)block;
  test_phi.block = block;
  if (iVar1 == 1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&((test_phi.block)->super_IVariant).self);
    notify_variable_access(this,uVar2,uVar3);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(test_phi.block)->next_block);
    set_current_block::anon_class_16_2_f791057a::operator()
              ((anon_class_16_2_f791057a *)&__range2,uVar2);
  }
  else if (iVar1 == 2) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&((test_phi.block)->super_IVariant).self);
    notify_variable_access(this,uVar2,uVar3);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(test_phi.block)->true_block);
    set_current_block::anon_class_16_2_f791057a::operator()
              ((anon_class_16_2_f791057a *)&__range2,uVar2);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(test_phi.block)->false_block);
    set_current_block::anon_class_16_2_f791057a::operator()
              ((anon_class_16_2_f791057a *)&__range2,uVar2);
  }
  else if (iVar1 == 3) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&((test_phi.block)->super_IVariant).self);
    notify_variable_access(this,uVar2,uVar3);
    this_00 = &(test_phi.block)->cases;
    __end2 = VectorView<spirv_cross::SPIRBlock::Case>::begin
                       (&this_00->super_VectorView<spirv_cross::SPIRBlock::Case>);
    pCVar4 = VectorView<spirv_cross::SPIRBlock::Case>::end
                       (&this_00->super_VectorView<spirv_cross::SPIRBlock::Case>);
    for (; __end2 != pCVar4; __end2 = __end2 + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end2->block);
      set_current_block::anon_class_16_2_f791057a::operator()
                ((anon_class_16_2_f791057a *)&__range2,uVar2);
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(test_phi.block)->default_block);
    if (uVar2 != 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(test_phi.block)->default_block);
      set_current_block::anon_class_16_2_f791057a::operator()
                ((anon_class_16_2_f791057a *)&__range2,uVar2);
    }
  }
  return;
}

Assistant:

void Compiler::AnalyzeVariableScopeAccessHandler::set_current_block(const SPIRBlock &block)
{
	current_block = &block;

	// If we're branching to a block which uses OpPhi, in GLSL
	// this will be a variable write when we branch,
	// so we need to track access to these variables as well to
	// have a complete picture.
	const auto test_phi = [this, &block](uint32_t to) {
		auto &next = compiler.get<SPIRBlock>(to);
		for (auto &phi : next.phi_variables)
		{
			if (phi.parent == block.self)
			{
				accessed_variables_to_block[phi.function_variable].insert(block.self);
				// Phi variables are also accessed in our target branch block.
				accessed_variables_to_block[phi.function_variable].insert(next.self);

				notify_variable_access(phi.local_variable, block.self);
			}
		}
	};

	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		notify_variable_access(block.condition, block.self);
		test_phi(block.next_block);
		break;

	case SPIRBlock::Select:
		notify_variable_access(block.condition, block.self);
		test_phi(block.true_block);
		test_phi(block.false_block);
		break;

	case SPIRBlock::MultiSelect:
		notify_variable_access(block.condition, block.self);
		for (auto &target : block.cases)
			test_phi(target.block);
		if (block.default_block)
			test_phi(block.default_block);
		break;

	default:
		break;
	}
}